

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::AdamOptimizer::ByteSizeLong(AdamOptimizer *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->learningrate_ == (DoubleParameter *)0x0 ||
      this == (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DoubleParameter>(this->learningrate_);
    sVar1 = sVar1 + 1;
  }
  if (this->minibatchsize_ != (Int64Parameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Parameter>(this->minibatchsize_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->beta1_ != (DoubleParameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DoubleParameter>(this->beta1_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->beta2_ != (DoubleParameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DoubleParameter>(this->beta2_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->eps_ != (DoubleParameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DoubleParameter>(this->eps_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t AdamOptimizer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.AdamOptimizer)
  size_t total_size = 0;

  // .CoreML.Specification.DoubleParameter learningRate = 1;
  if (this->has_learningrate()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->learningrate_);
  }

  // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
  if (this->has_minibatchsize()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->minibatchsize_);
  }

  // .CoreML.Specification.DoubleParameter beta1 = 3;
  if (this->has_beta1()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->beta1_);
  }

  // .CoreML.Specification.DoubleParameter beta2 = 4;
  if (this->has_beta2()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->beta2_);
  }

  // .CoreML.Specification.DoubleParameter eps = 5;
  if (this->has_eps()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->eps_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}